

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::plus_equal_column(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                    *this,Column *target,A_ds_type *other,Arith_element w)

{
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
  *this_00;
  uint uVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  Element EVar5;
  node_ptr next;
  pointer ppVar6;
  pointer pPVar7;
  Cell *tmp_cell_ptr;
  Field_Zp *this_01;
  pointer ppVar8;
  iterator tmp_it;
  node_ptr plVar9;
  node_ptr plVar10;
  Arith_element local_7c;
  Persistent_cohomology_cell<unsigned_int,_int> local_78;
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
  *local_48;
  node_ptr local_40;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *local_38;
  
  local_40 = (node_ptr)&target->col_;
  plVar9 = (target->col_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  ppVar8 = (other->
           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = (other->
           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_7c = w;
  local_38 = this;
  if (ppVar8 != ppVar6 && plVar9 != local_40) {
    local_48 = (Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                *)&this->cell_pool_;
    do {
      plVar2 = plVar9 + -1;
      uVar1 = ppVar8->first;
      if (*(uint *)&plVar9[1].next_ < uVar1) {
        plVar10 = plVar9->next_;
      }
      else if (uVar1 < *(uint *)&plVar9[1].next_) {
        local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
             (node_ptr)0x0;
        local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
             (node_ptr)0x0;
        local_78.coefficient_ = 0;
        local_78.key_ = uVar1;
        local_78.self_col_ = target;
        pPVar7 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                 ::
                 construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                           (local_48,&local_78);
        if (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ !=
            (node_ptr)0x0) {
          (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_)->
          next_ = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_
          ;
          (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_)->
          prev_ = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_
          ;
        }
        EVar5 = Field_Zp::plus_times_equal
                          (&this->coeff_field_,&pPVar7->coefficient_,&ppVar8->second,&local_7c);
        pPVar7->coefficient_ = EVar5;
        plVar2 = plVar9->prev_;
        (pPVar7->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.prev_ = plVar2
        ;
        (pPVar7->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.next_ = plVar9
        ;
        plVar9->prev_ = (node_ptr)&pPVar7->super_base_hook_cam_v;
        plVar2->next_ = (node_ptr)&pPVar7->super_base_hook_cam_v;
        ppVar8 = ppVar8 + 1;
        plVar10 = plVar9;
      }
      else {
        EVar5 = Field_Zp::plus_times_equal
                          (&this->coeff_field_,(Element *)((long)&plVar9[1].next_ + 4),
                           &ppVar8->second,&local_7c);
        *(Element *)((long)&plVar9[1].next_ + 4) = EVar5;
        ppVar8 = ppVar8 + 1;
        plVar10 = plVar9->next_;
        if (EVar5 == 0) {
          plVar3 = plVar9->prev_;
          plVar3->next_ = plVar10;
          plVar10->prev_ = plVar3;
          plVar3 = plVar9[-1].next_;
          if (plVar3 != (node_ptr)0x0) {
            plVar4 = plVar9[-1].prev_;
            plVar4->next_ = plVar3;
            plVar3->prev_ = plVar4;
            plVar2->next_ = (node_ptr)0x0;
            plVar9[-1].prev_ = (node_ptr)0x0;
          }
          plVar2->next_ = *(node_ptr *)local_48;
          *(node_ptr *)local_48 = plVar2;
        }
      }
      ppVar6 = (other->
               super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    } while ((plVar10 != local_40) && (plVar9 = plVar10, ppVar8 != ppVar6));
  }
  if (ppVar8 != ppVar6) {
    this_00 = &local_38->cell_pool_;
    this_01 = &local_38->coeff_field_;
    do {
      local_78.key_ = ppVar8->first;
      local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)0x0;
      local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
           (node_ptr)0x0;
      local_78.coefficient_ = 0;
      local_78.self_col_ = target;
      pPVar7 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
               ::
               construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                         ((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                           *)this_00,&local_78);
      if (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_)->next_
             = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_;
        (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_)->prev_
             = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_;
      }
      EVar5 = Field_Zp::plus_times_equal(this_01,&pPVar7->coefficient_,&ppVar8->second,&local_7c);
      pPVar7->coefficient_ = EVar5;
      plVar9 = (target->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (pPVar7->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.prev_ = plVar9;
      (pPVar7->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.next_ = local_40
      ;
      (target->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           (node_ptr)&pPVar7->super_base_hook_cam_v;
      plVar9->next_ = (node_ptr)&pPVar7->super_base_hook_cam_v;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != (other->
                       super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void plus_equal_column(Column & target, A_ds_type const& other  // value_type is pair<Simplex_key,Arith_element>
                         , Arith_element w) {
    auto target_it = target.col_.begin();
    auto other_it = other.begin();
    while (target_it != target.col_.end() && other_it != other.end()) {
      if (target_it->key_ < other_it->first) {
        ++target_it;
      } else {
        if (target_it->key_ > other_it->first) {
          Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first   // key
              , coeff_field_.additive_identity(), &target));

          cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);

          target.col_.insert(target_it, *cell_tmp);

          ++other_it;
        } else {  // it1->key == it2->key
          // target_it->coefficient_ <- target_it->coefficient_ + other_it->second * w
          target_it->coefficient_ = coeff_field_.plus_times_equal(target_it->coefficient_, other_it->second, w);
          if (target_it->coefficient_ == coeff_field_.additive_identity()) {
            auto tmp_it = target_it;
            ++target_it;
            ++other_it;   // iterators remain valid
            Cell * tmp_cell_ptr = &(*tmp_it);
            target.col_.erase(tmp_it);  // removed from column

            cell_pool_.destroy(tmp_cell_ptr);  // delete from memory
          } else {
            ++target_it;
            ++other_it;
          }
        }
      }
    }
    while (other_it != other.end()) {
      Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first, coeff_field_.additive_identity(), &target));
      cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);
      target.col_.insert(target.col_.end(), *cell_tmp);

      ++other_it;
    }
  }